

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputM2
                 (vector<float,_std::allocator<float>_> *in,
                 vector<float,_std::allocator<float>_> *expected)

{
  reference pvVar1;
  vector<float,_std::allocator<float>_> *expected_local;
  vector<float,_std::allocator<float>_> *in_local;
  
  std::vector<float,_std::allocator<float>_>::resize(in,0x10);
  std::vector<float,_std::allocator<float>_>::resize(expected,4);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,0);
  *pvVar1 = 1.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,2);
  *pvVar1 = 3.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,4);
  *pvVar1 = 5.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,1);
  *pvVar1 = 2.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,3);
  *pvVar1 = 4.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,5);
  *pvVar1 = 6.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,8);
  *pvVar1 = 1.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,0xc);
  *pvVar1 = 4.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,9);
  *pvVar1 = 2.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,0xd);
  *pvVar1 = 5.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,10);
  *pvVar1 = 3.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,0xe);
  *pvVar1 = 6.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,0);
  *pvVar1 = 22.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,2);
  *pvVar1 = 49.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,1);
  *pvVar1 = 28.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,3);
  *pvVar1 = 64.0;
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  layout(column_major) mat3x2 m0;\n  layout(column_major) mat2x3 m1;\n} g_input;\nlayout(std430, binding = 1) buffer Output {\n  layout(column_major) mat2 m;\n} g_output;\nvoid main() { g_output.m = g_input.m0 * g_input.m1; }"
  ;
}

Assistant:

const char* GetInputM2(std::vector<float>& in, std::vector<float>& expected)
{
	in.resize(16);
	expected.resize(4);
	// mat3x2
	in[0] = 1.0f;
	in[2] = 3.0f;
	in[4] = 5.0f;
	in[1] = 2.0f;
	in[3] = 4.0f;
	in[5] = 6.0f;
	// mat2x3
	in[8]  = 1.0f;
	in[12] = 4.0f;
	in[9]  = 2.0f;
	in[13] = 5.0f;
	in[10] = 3.0f;
	in[14] = 6.0f;
	// mat2
	expected[0] = 22.0f;
	expected[2] = 49.0f;
	expected[1] = 28.0f;
	expected[3] = 64.0f;

	return NL "layout(std430, binding = 0) buffer Input {" NL "  layout(column_major) mat3x2 m0;" NL
			  "  layout(column_major) mat2x3 m1;" NL "} g_input;" NL "layout(std430, binding = 1) buffer Output {" NL
			  "  layout(column_major) mat2 m;" NL "} g_output;" NL
			  "void main() { g_output.m = g_input.m0 * g_input.m1; }";
}